

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O1

ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
 __thiscall
(anonymous_namespace)::
BuildHighbdLumaParams<void(*)(unsigned_short_const*,int,unsigned_short*,int,int,int,ConvolveParams*,int)>
          (_anonymous_namespace_ *this,
          _func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_ConvolveParams_ptr_int
          *test_func)

{
  int iVar1;
  BlockSize BVar2;
  int iVar3;
  undefined4 uVar4;
  ulong uVar5;
  pointer __src;
  _Base_ptr p_Var6;
  undefined8 *puVar7;
  pointer pTVar8;
  undefined8 *puVar9;
  ulong uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  int b;
  long lVar12;
  _Link_type __x;
  _Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
  *p_Var13;
  pointer pTVar14;
  pointer pTVar15;
  pointer pTVar16;
  ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
  PVar17;
  set<(anonymous_namespace)::BlockSize,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
  sizes;
  undefined1 local_78 [32];
  _Rb_tree_node_base local_58;
  undefined8 local_38;
  
  local_78._16_8_ = (_Base_ptr)0xc0000000a;
  local_58._M_left = &local_58;
  local_58._M_color = _S_red;
  lVar12 = 0;
  local_58._M_parent = (_Base_ptr)0x0;
  local_38 = 0;
  local_58._M_right = local_58._M_left;
  do {
    local_78._0_4_ = ZEXT14(::block_size_wide[lVar12]);
    local_78._4_4_ = ZEXT14(::block_size_high[lVar12]);
    __x = (_Link_type)local_78;
    std::
    set<(anonymous_namespace)::BlockSize,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
    ::insert((set<(anonymous_namespace)::BlockSize,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
              *)(local_78 + 0x18),(value_type *)local_78);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x16);
  pTVar8 = (pointer)0x0;
  pTVar15 = (pointer)0x0;
  __src = (pointer)0x0;
  p_Var6 = (_Base_ptr)0x0;
  do {
    local_78._8_8_ = p_Var6;
    if (local_58._M_left != &local_58) {
      iVar1 = *(int *)((long)&p_Var6->_M_left + (long)local_78);
      pTVar14 = __src;
      p_Var6 = local_58._M_left;
      do {
        BVar2.width_ = p_Var6[1]._M_color;
        BVar2.height_ = *(int *)&p_Var6[1].field_0x4;
        if (pTVar15 == pTVar8) {
          lVar12 = (long)pTVar15 - (long)pTVar14;
          if (lVar12 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar5 = (lVar12 >> 3) * -0x5555555555555555;
          uVar10 = uVar5;
          if (pTVar15 == pTVar14) {
            uVar10 = 1;
          }
          p_Var13 = (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                     *)(uVar10 + uVar5);
          if ((_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
               *)0x555555555555554 < p_Var13) {
            p_Var13 = (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                       *)0x555555555555555;
          }
          if (CARRY8(uVar10,uVar5)) {
            p_Var13 = (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                       *)0x555555555555555;
          }
          __src = std::
                  _Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                  ::_M_allocate(p_Var13,(size_t)__x);
          *(BlockSize *)((long)__src + lVar12) = BVar2;
          *(int *)((long)__src + lVar12 + 8) = iVar1;
          *(_func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_ConvolveParams_ptr_int
            **)((long)__src + lVar12 + 0x10) = test_func;
          pTVar16 = __src;
          for (pTVar8 = pTVar14; pTVar15 != pTVar8; pTVar8 = pTVar8 + 1) {
            pTVar16->test_func_ = pTVar8->test_func_;
            iVar3 = pTVar8->bd_;
            uVar4 = *(undefined4 *)&pTVar8->field_0xc;
            pTVar16->block_ = pTVar8->block_;
            pTVar16->bd_ = iVar3;
            *(undefined4 *)&pTVar16->field_0xc = uVar4;
            pTVar16 = pTVar16 + 1;
          }
          if (pTVar14 != (pointer)0x0) {
            operator_delete(pTVar14);
          }
          pTVar8 = __src + (long)p_Var13;
        }
        else {
          pTVar15->block_ = BVar2;
          pTVar15->bd_ = iVar1;
          pTVar15->test_func_ = test_func;
          __src = pTVar14;
          pTVar16 = pTVar15;
        }
        pTVar15 = pTVar16 + 1;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        pTVar14 = __src;
      } while (p_Var6 != &local_58);
    }
    p_Var6 = (_Base_ptr)(local_78._8_8_ + 4);
  } while (p_Var6 != (_Base_ptr)&DAT_00000008);
  std::
  _Rb_tree<(anonymous_namespace)::BlockSize,_(anonymous_namespace)::BlockSize,_std::_Identity<(anonymous_namespace)::BlockSize>,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
  ::_M_erase((_Rb_tree<(anonymous_namespace)::BlockSize,_(anonymous_namespace)::BlockSize,_std::_Identity<(anonymous_namespace)::BlockSize>,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
              *)local_58._M_parent,__x);
  puVar7 = (undefined8 *)operator_new(0x20);
  *puVar7 = &PTR__ValuesInIteratorRangeGenerator_01094cd8;
  puVar7[1] = 0;
  puVar7[2] = 0;
  puVar7[3] = 0;
  lVar12 = (long)pTVar15 - (long)__src;
  p_Var13 = (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
             *)((lVar12 >> 3) * -0x5555555555555555);
  if (p_Var13 < (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                 *)0x555555555555556) {
    pTVar8 = std::
             _Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
             ::_M_allocate(p_Var13,(size_t)__x);
    puVar7[1] = pTVar8;
    puVar7[3] = (long)pTVar8 + lVar12;
    if (__src != pTVar15) {
      uVar10 = (lVar12 - 0x18U) / 0x18;
      memcpy(pTVar8,__src,uVar10 * 0x18 + 0x18);
      pTVar8 = pTVar8 + uVar10 + 1;
    }
    puVar7[2] = pTVar8;
    *(undefined8 **)this = puVar7;
    *(undefined8 *)(this + 8) = 0;
    puVar9 = (undefined8 *)operator_new(0x18);
    puVar9[1] = 0x100000001;
    *puVar9 = &PTR___Sp_counted_base_01094da0;
    puVar9[2] = puVar7;
    *(undefined8 **)(this + 8) = puVar9;
    _Var11._M_pi = extraout_RDX;
    if (__src != (pointer)0x0) {
      operator_delete(__src);
      _Var11._M_pi = extraout_RDX_00;
    }
    PVar17.impl_.
    super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var11._M_pi;
    PVar17.impl_.
    super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)this;
    return (ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
            )PVar17.impl_.
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

::testing::internal::ParamGenerator<TestParam<T>> BuildHighbdLumaParams(
    T test_func) {
  return ::testing::ValuesIn(GetHighbdLumaTestParams(test_func));
}